

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O2

void blake2b_digest(ssh_hash *hash,uint8_t *digest)

{
  uint i;
  long lVar1;
  uint8_t hash_pre [128];
  
  memset((undefined1 *)((long)&hash[-3].vt[-3].extra + 4) + (long)&hash->vt,0,
         0x80 - (long)hash[-3].vt);
  f_outer((uint64_t *)&hash[-0x10].binarysink_,(uint8_t *)((long)&hash[-0xc].binarysink_ + 4),
          (uint64_t)hash[-3].binarysink_,(uint64_t)hash[-2].vt,1);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    *(BinarySink **)(hash_pre + lVar1 * 8) = (&hash[-0x10].binarysink_)[lVar1];
  }
  memcpy(digest,hash_pre,(ulong)*(uint *)&hash[-0xc].binarysink_);
  smemclr(hash_pre,0x80);
  return;
}

Assistant:

static void blake2b_digest(ssh_hash *hash, uint8_t *digest)
{
    blake2b *s = container_of(hash, blake2b, hash);

    memset(s->block + s->used, 0, sizeof(s->block) - s->used);
    f_outer(s->h, s->block, s->lenhi, s->lenlo, 1);

    uint8_t hash_pre[128];
    for (unsigned i = 0; i < 8; i++)
        PUT_64BIT_LSB_FIRST(hash_pre + 8*i, s->h[i]);
    memcpy(digest, hash_pre, s->hashlen);
    smemclr(hash_pre, sizeof(hash_pre));
}